

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::WriteObjectRuleFiles
          (cmMakefileTargetGenerator *this,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  iterator iVar3;
  ostream *poVar4;
  char *pcVar5;
  string depMakeFile;
  string obj;
  string srcFullPath;
  string objFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string dir;
  string local_258;
  key_type local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  cmLocalGenerator::GetSourceFileLanguage_abi_cxx11_
            (&local_1d8,&this->LocalGenerator->super_cmLocalGenerator,source);
  if (local_1d8._M_string_length != 0) {
    psVar2 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,source);
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
              (&local_238,this->LocalGenerator,this->Target);
    std::__cxx11::string::append((char *)&local_238);
    std::__cxx11::string::_M_append((char *)&local_238,(ulong)(psVar2->_M_dataplus)._M_p);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->ObjectFiles)._M_t,&local_238);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header)
    {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->ObjectFiles,&local_238);
      cmsys::SystemTools::GetFilenamePath((string *)local_198,&local_238);
      cmLocalUnixMakefileGenerator3::ConvertToFullPath
                (&local_258,this->LocalGenerator,(string *)local_198);
      cmsys::SystemTools::MakeDirectory(local_258._M_dataplus._M_p);
      paVar1 = &local_258.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar1) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Objects,&local_238);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->CleanFiles,&local_238);
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      local_258._M_dataplus._M_p = (pointer)paVar1;
      WriteObjectBuildFile(this,&local_238,&local_1d8,source,&local_1b8);
      pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      std::__cxx11::string::string((string *)&local_1f8,pcVar5,(allocator *)&local_218);
      std::__cxx11::string::append((char *)&local_1f8);
      std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_238._M_dataplus._M_p);
      cmOutputConverter::Convert
                (&local_218,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                 &local_1f8,FULL,UNCHANGED);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmOutputConverter::Convert
                (&local_218,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                 psVar2,FULL,UNCHANGED);
      cmLocalUnixMakefileGenerator3::AddImplicitDepends
                (this->LocalGenerator,this->Target,&local_1d8,local_1f8._M_dataplus._M_p,
                 local_218._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar1) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b8);
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Warning: Source file \"",0x16);
      psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"\" is listed multiple times for target \"",0x27);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(this->Target->Name)._M_dataplus._M_p,
                          (this->Target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Message(local_258._M_dataplus._M_p,"Warning");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator
::WriteObjectRuleFiles(cmSourceFile const& source)
{
  // Identify the language of the source file.
  const std::string& lang =
    this->LocalGenerator->GetSourceFileLanguage(source);
  if(lang.empty())
    {
    // don't know anything about this file so skip it
    return;
    }

  // Get the full path name of the object file.
  std::string const& objectName = this->GeneratorTarget
                                      ->GetObjectName(&source);
  std::string obj = this->LocalGenerator->GetTargetDirectory(*this->Target);
  obj += "/";
  obj += objectName;

  // Avoid generating duplicate rules.
  if(this->ObjectFiles.find(obj) == this->ObjectFiles.end())
    {
    this->ObjectFiles.insert(obj);
    }
  else
    {
    std::ostringstream err;
    err << "Warning: Source file \""
        << source.GetFullPath()
        << "\" is listed multiple times for target \""
        << this->Target->GetName()
        << "\".";
    cmSystemTools::Message(err.str().c_str(), "Warning");
    return;
    }

  // Create the directory containing the object file.  This may be a
  // subdirectory under the target's directory.
  std::string dir = cmSystemTools::GetFilenamePath(obj);
  cmSystemTools::MakeDirectory
    (this->LocalGenerator->ConvertToFullPath(dir).c_str());

  // Save this in the target's list of object files.
  this->Objects.push_back(obj);
  this->CleanFiles.push_back(obj);

  // TODO: Remove
  //std::string relativeObj
  //= this->LocalGenerator->GetHomeRelativeOutputPath();
  //relativeObj += obj;

  // we compute some depends when writing the depend.make that we will also
  // use in the build.make, same with depMakeFile
  std::vector<std::string> depends;
  std::string depMakeFile;

  // generate the build rule file
  this->WriteObjectBuildFile(obj, lang, source, depends);

  // The object file should be checked for dependency integrity.
  std::string objFullPath = this->Makefile->GetCurrentBinaryDirectory();
  objFullPath += "/";
  objFullPath += obj;
  objFullPath =
    this->Convert(objFullPath, cmLocalGenerator::FULL);
  std::string srcFullPath =
    this->Convert(source.GetFullPath(), cmLocalGenerator::FULL);
  this->LocalGenerator->
    AddImplicitDepends(*this->Target, lang,
                       objFullPath.c_str(),
                       srcFullPath.c_str());
}